

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  stbi__uint16 sVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  stbi__uint32 sVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  char *pcVar22;
  stbi_uc *psVar23;
  void *pvVar24;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar25;
  stbi__uint16 *data_02;
  byte *pbVar26;
  uchar *puVar27;
  byte bVar28;
  uint uVar29;
  stbi_uc *psVar30;
  byte *pbVar31;
  stbi_uc sVar32;
  uint uVar33;
  long lVar34;
  int iVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  stbi__uint32 sVar39;
  ulong uVar40;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar41;
  ulong uVar42;
  stbi__uint16 *psVar43;
  stbi__uint16 *psVar44;
  long in_FS_OFFSET;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar124 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  int iVar154;
  int iVar158;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  stbi_uc pal [256] [4];
  uint local_8990;
  stbi__uint16 *local_8968;
  ulong local_8958;
  stbi__uint16 *local_8948;
  uint local_893c;
  stbi__bmp_data local_88dc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar30 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar12 = stbi__check_png_header(s);
  psVar25 = s->img_buffer_original;
  s->img_buffer = psVar25;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar12 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar12 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar8 = local_88a8._0_8_;
      if (iVar12 == 0) {
        data = (stbi__context *)0x0;
      }
      else {
        iVar12 = 8;
        if ((8 < local_88a8.flags) && (iVar12 = 0x10, local_88a8.flags != 0x10)) {
          pcVar22 = "PNG not supported: unsupported color depth";
          goto LAB_00162849;
        }
        ri->bits_per_channel = iVar12;
        data = (stbi__context *)local_88a8.history;
        if ((req_comp != 0) && (iVar12 = *(int *)(local_88a8._0_8_ + 0xc), iVar12 != req_comp)) {
          if (local_88a8.flags < 9) {
            data = (stbi__context *)
                   stbi__convert_format
                             (local_88a8.history,iVar12,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data = (stbi__context *)
                   stbi__convert_format16
                             ((stbi__uint16 *)local_88a8.history,iVar12,req_comp,
                              *(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if (data == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar8;
        *y = *(stbi__uint32 *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
      }
      free(local_88a8.history);
      free(local_88a8.background);
      goto LAB_00162cdb;
    }
    pcVar22 = "Internal error";
    goto LAB_00162849;
  }
  if (psVar25 < s->img_buffer_original_end) {
LAB_00162888:
    psVar23 = psVar25 + 1;
    s->img_buffer = psVar23;
    if (*psVar25 != 'B') goto LAB_00162a26;
    if (s->img_buffer_end <= psVar23) {
      if (s->read_from_callbacks == 0) goto LAB_00162a26;
      stbi__refill_buffer(s);
      psVar23 = s->img_buffer;
    }
    s->img_buffer = psVar23 + 1;
    if (*psVar23 != 'M') goto LAB_00162a26;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar13 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    uVar13 = iVar12 << 0x10 | uVar13;
    if (((0x38 < uVar13) || ((0x100010000001000U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
       (uVar13 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar13 == 0x7c) goto LAB_00162953;
      goto LAB_00162a3a;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00162953:
    local_88dc.all_a = 0xff;
    pvVar24 = stbi__bmp_parse_header(s,&local_88dc);
    local_8990 = local_88dc.all_a;
    if (pvVar24 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar13 = s->img_y;
    uVar17 = -uVar13;
    if (0 < (int)uVar13) {
      uVar17 = uVar13;
    }
    s->img_y = uVar17;
    if ((uVar17 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88dc.hsz != 0xc) {
        if (local_88dc.bpp < 0x10) {
          uVar17 = local_88dc.offset - (local_88dc.extra_read + local_88dc.hsz) >> 2;
          goto LAB_00162e5a;
        }
LAB_00163069:
        iVar12 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (((0xfffffbff < iVar12 - 0x401U) && (iVar12 <= local_88dc.offset)) &&
           (local_88dc.offset - iVar12 < 0x401)) {
          stbi__skip(s,local_88dc.offset - iVar12);
          local_8958 = 0;
          bVar9 = true;
          bVar7 = bVar9;
          if (local_88dc.bpp != 0x18 || local_88dc.ma != 0xff000000) goto LAB_00162e88;
          iVar12 = 3;
          iVar35 = 0x18;
          bVar7 = true;
          goto LAB_00162eae;
        }
LAB_001634cd:
        pcVar22 = "Corrupt BMP";
        goto LAB_00162849;
      }
      if (0x17 < local_88dc.bpp) goto LAB_00163069;
      uVar17 = ((local_88dc.offset - local_88dc.extra_read) + -0x18) / 3;
LAB_00162e5a:
      local_8958 = (ulong)uVar17;
      if (uVar17 == 0) goto LAB_00163069;
      bVar7 = false;
LAB_00162e88:
      bVar9 = local_88dc.ma == 0xff000000;
      iVar12 = 4 - (uint)(local_88dc.ma == 0);
      iVar35 = local_88dc.bpp;
LAB_00162eae:
      s->img_n = iVar12;
      if (2 < req_comp) {
        iVar12 = req_comp;
      }
      sVar15 = s->img_x;
      sVar4 = s->img_y;
      iVar14 = stbi__mad3sizes_valid(iVar12,sVar15,sVar4,0);
      if (iVar14 == 0) goto LAB_001634cd;
      data_00 = (uchar *)stbi__malloc_mad3(iVar12,sVar15,sVar4,0);
      if (data_00 != (uchar *)0x0) {
        if (iVar35 < 0x10) {
          iVar14 = (int)local_8958;
          if (!bVar7 && iVar14 < 0x101) {
            if (0 < iVar14) {
              psVar30 = s->img_buffer;
              uVar42 = 0;
              psVar25 = psVar30;
              do {
                psVar23 = s->img_buffer_end;
                if (psVar30 < psVar23) {
LAB_00162f6e:
                  psVar25 = psVar30 + 1;
                  s->img_buffer = psVar25;
                  sVar32 = *psVar30;
                  psVar30 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar30 = s->img_buffer;
                    psVar23 = s->img_buffer_end;
                    goto LAB_00162f6e;
                  }
                  sVar32 = '\0';
                }
                local_88a8.pal[uVar42 - 0xd][2] = sVar32;
                if (psVar30 < psVar23) {
LAB_00162fb1:
                  psVar25 = psVar30 + 1;
                  s->img_buffer = psVar25;
                  sVar32 = *psVar30;
                  psVar30 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar30 = s->img_buffer;
                    psVar23 = s->img_buffer_end;
                    goto LAB_00162fb1;
                  }
                  sVar32 = '\0';
                }
                local_88a8.pal[uVar42 - 0xd][1] = sVar32;
                if (psVar30 < psVar23) {
LAB_00162fec:
                  psVar25 = psVar30 + 1;
                  s->img_buffer = psVar25;
                  sVar32 = *psVar30;
                  psVar30 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar30 = s->img_buffer;
                    goto LAB_00162fec;
                  }
                  sVar32 = '\0';
                }
                local_88a8.pal[uVar42 - 0xd][0] = sVar32;
                if (local_88dc.hsz != 0xc) {
                  if (s->img_buffer_end <= psVar25) {
                    psVar30 = psVar25;
                    if (s->read_from_callbacks == 0) goto LAB_0016303d;
                    stbi__refill_buffer(s);
                    psVar25 = s->img_buffer;
                  }
                  psVar30 = psVar25 + 1;
                  s->img_buffer = psVar30;
                  psVar25 = psVar30;
                }
LAB_0016303d:
                local_88a8.pal[uVar42 - 0xd][3] = 0xff;
                uVar42 = uVar42 + 1;
              } while (local_8958 != uVar42);
            }
            stbi__skip(s,(iVar14 * (local_88dc.hsz == 0xc | 0xfffffffc) + local_88dc.offset) -
                         (local_88dc.hsz + local_88dc.extra_read));
            if (iVar35 == 1) {
              sVar15 = s->img_y;
              if (0 < (int)sVar15) {
                sVar4 = s->img_x;
                iVar14 = 0;
                iVar35 = 0;
                do {
                  pbVar26 = s->img_buffer;
                  if (pbVar26 < s->img_buffer_end) {
LAB_0016413a:
                    s->img_buffer = pbVar26 + 1;
                    uVar17 = (uint)*pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                      goto LAB_0016413a;
                    }
                    uVar17 = 0;
                  }
                  sVar15 = s->img_x;
                  if (0 < (int)sVar15) {
                    sVar39 = 0;
                    uVar33 = 7;
                    do {
                      uVar42 = (ulong)((uVar17 >> (uVar33 & 0x1f) & 1) != 0);
                      data_00[iVar14] = local_88a8.pal[uVar42 - 0xd][0];
                      data_00[(long)iVar14 + 1] = local_88a8.pal[uVar42 - 0xd][1];
                      data_00[(long)iVar14 + 2] = local_88a8.pal[uVar42 - 0xd][2];
                      iVar38 = iVar14 + 3;
                      if (iVar12 == 4) {
                        data_00[(long)iVar14 + 3] = 0xff;
                        iVar38 = iVar14 + 4;
                      }
                      iVar14 = iVar38;
                      sVar39 = sVar39 + 1;
                      if (sVar39 == sVar15) break;
                      if ((int)uVar33 < 1) {
                        if (s->img_buffer_end <= pbVar26) {
                          if (s->read_from_callbacks == 0) {
                            uVar17 = 0;
                            uVar33 = 7;
                            goto LAB_00164202;
                          }
                          stbi__refill_buffer(s);
                          pbVar26 = s->img_buffer;
                          sVar15 = s->img_x;
                        }
                        s->img_buffer = pbVar26 + 1;
                        uVar17 = (uint)*pbVar26;
                        uVar33 = 7;
                        pbVar26 = pbVar26 + 1;
                      }
                      else {
                        uVar33 = uVar33 - 1;
                      }
LAB_00164202:
                    } while ((int)sVar39 < (int)sVar15);
                  }
                  stbi__skip(s,-(sVar4 + 7 >> 3) & 3);
                  iVar35 = iVar35 + 1;
                  sVar15 = s->img_y;
                } while (iVar35 < (int)sVar15);
              }
              goto LAB_00164248;
            }
            if (iVar35 == 8) {
              uVar17 = s->img_x;
            }
            else {
              if (iVar35 != 4) goto LAB_001634c5;
              uVar17 = s->img_x + 1 >> 1;
            }
            sVar15 = s->img_y;
            if (0 < (int)sVar15) {
              uVar42 = 0;
              iVar14 = 0;
              do {
                if (0 < (int)s->img_x) {
                  pbVar26 = s->img_buffer;
                  iVar38 = 0;
                  do {
                    if (pbVar26 < s->img_buffer_end) {
LAB_00163fa5:
                      s->img_buffer = pbVar26 + 1;
                      uVar33 = (uint)*pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                        goto LAB_00163fa5;
                      }
                      uVar33 = 0;
                    }
                    uVar29 = uVar33 & 0xf;
                    uVar19 = uVar33 >> 4;
                    if (iVar35 != 4) {
                      uVar19 = uVar33;
                    }
                    uVar40 = (ulong)uVar19;
                    if (iVar35 != 4) {
                      uVar29 = 0;
                    }
                    lVar34 = (long)(int)uVar42;
                    uVar36 = lVar34 + 3;
                    data_00[lVar34] = local_88a8.pal[uVar40 - 0xd][0];
                    data_00[lVar34 + 1] = local_88a8.pal[uVar40 - 0xd][1];
                    data_00[lVar34 + 2] = local_88a8.pal[uVar40 - 0xd][2];
                    if (iVar12 == 4) {
                      data_00[lVar34 + 3] = 0xff;
                      uVar36 = (ulong)((int)uVar42 + 4);
                    }
                    if (iVar38 + 1U == s->img_x) {
                      uVar42 = uVar36 & 0xffffffff;
                      break;
                    }
                    if (iVar35 == 8) {
                      if (s->img_buffer_end <= pbVar26) {
                        if (s->read_from_callbacks == 0) {
                          uVar29 = 0;
                          goto LAB_00164065;
                        }
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                      }
                      s->img_buffer = pbVar26 + 1;
                      uVar29 = (uint)*pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
LAB_00164065:
                    lVar34 = (long)(int)uVar36;
                    uVar42 = lVar34 + 3;
                    uVar40 = (ulong)uVar29;
                    data_00[lVar34] = local_88a8.pal[uVar40 - 0xd][0];
                    data_00[lVar34 + 1] = local_88a8.pal[uVar40 - 0xd][1];
                    data_00[lVar34 + 2] = local_88a8.pal[uVar40 - 0xd][2];
                    if (iVar12 == 4) {
                      data_00[lVar34 + 3] = 0xff;
                      uVar42 = (ulong)((int)uVar36 + 4);
                    }
                    iVar38 = iVar38 + 2;
                  } while (iVar38 < (int)s->img_x);
                }
                stbi__skip(s,-uVar17 & 3);
                iVar14 = iVar14 + 1;
                sVar15 = s->img_y;
              } while (iVar14 < (int)sVar15);
            }
            goto LAB_00164248;
          }
        }
        else {
          stbi__skip(s,local_88dc.offset - (local_88dc.hsz + local_88dc.extra_read));
          if (iVar35 != 0x10) {
            if (iVar35 == 0x20) {
              local_893c = 0;
              if (!(bool)((local_88dc.mr == 0xff0000 &&
                          (local_88dc.mg == 0xff00 && local_88dc.mb == 0xff)) & bVar9))
              goto LAB_001633fa;
              bVar7 = true;
            }
            else {
              local_893c = 0;
              if (iVar35 != 0x18) goto LAB_001633fa;
              local_893c = s->img_x & 3;
              bVar7 = false;
            }
            bVar9 = false;
            iVar14 = 0;
            iVar38 = 0;
            iVar18 = 0;
            iVar154 = 0;
            uVar17 = 0;
            uVar33 = 0;
            uVar19 = 0;
            uVar29 = 0;
LAB_00163528:
            sVar15 = s->img_y;
            if (0 < (int)sVar15) {
              uVar42 = 0;
              local_88b0 = (ulong)(uVar19 << 2);
              local_88b8 = (ulong)(uVar29 << 2);
              iVar158 = 0;
              do {
                uVar40 = uVar42;
                if (bVar9) {
                  if (0 < (int)s->img_x) {
                    iVar37 = 0;
                    do {
                      uVar20 = stbi__get16le(s);
                      if (iVar35 != 0x10) {
                        iVar21 = stbi__get16le(s);
                        uVar20 = uVar20 | iVar21 << 0x10;
                      }
                      uVar41 = (uVar20 & local_88dc.mr) >> ((byte)iVar14 & 0x1f);
                      if (iVar14 < 0) {
                        uVar41 = (uVar20 & local_88dc.mr) << (-(byte)iVar14 & 0x1f);
                      }
                      uVar16 = (uVar20 & local_88dc.mg) >> ((byte)iVar38 & 0x1f);
                      if (iVar38 < 0) {
                        uVar16 = (uVar20 & local_88dc.mg) << (-(byte)iVar38 & 0x1f);
                      }
                      iVar21 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                       (uVar33 << 2));
                      bVar28 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar33 << 2];
                      uVar6 = (uVar20 & local_88dc.mb) >> ((byte)iVar18 & 0x1f);
                      if (iVar18 < 0) {
                        uVar6 = (uVar20 & local_88dc.mb) << (-(byte)iVar18 & 0x1f);
                      }
                      lVar34 = (long)(int)uVar42;
                      iVar5 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                      local_88b0);
                      bVar1 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                      data_00[lVar34] =
                           (uchar)((int)((uVar41 >> (8U - (char)uVar17 & 0x1f)) *
                                        *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table
                                                + (uVar17 << 2))) >>
                                  (stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar17 << 2]
                                  & 0x1f));
                      data_00[lVar34 + 1] =
                           (uchar)((int)((uVar16 >> (8U - (char)uVar33 & 0x1f)) * iVar21) >>
                                  (bVar28 & 0x1f));
                      data_00[lVar34 + 2] =
                           (uchar)((int)((uVar6 >> (8U - (char)uVar19 & 0x1f)) * iVar5) >>
                                  (bVar1 & 0x1f));
                      if (local_88dc.ma == 0) {
                        uVar20 = 0xff;
                      }
                      else {
                        uVar41 = (uVar20 & local_88dc.ma) >> ((byte)iVar154 & 0x1f);
                        if (iVar154 < 0) {
                          uVar41 = (uVar20 & local_88dc.ma) << (-(byte)iVar154 & 0x1f);
                        }
                        uVar20 = (int)((uVar41 >> (8U - (char)uVar29 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              local_88b8)) >>
                                 (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8] &
                                 0x1f);
                      }
                      uVar40 = lVar34 + 3;
                      if (iVar12 == 4) {
                        data_00[lVar34 + 3] = (uchar)uVar20;
                        uVar40 = (ulong)((int)uVar42 + 4);
                      }
                      local_8990 = local_8990 | uVar20;
                      iVar37 = iVar37 + 1;
                      uVar42 = uVar40 & 0xffffffff;
                    } while (iVar37 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  pbVar26 = s->img_buffer;
                  iVar37 = 0;
                  do {
                    pbVar31 = s->img_buffer_end;
                    if (pbVar26 < pbVar31) {
LAB_001637c5:
                      s->img_buffer = pbVar26 + 1;
                      bVar28 = *pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                        pbVar31 = s->img_buffer_end;
                        goto LAB_001637c5;
                      }
                      bVar28 = 0;
                    }
                    lVar34 = (long)(int)uVar42;
                    data_00[lVar34 + 2] = bVar28;
                    if (pbVar26 < pbVar31) {
LAB_0016380c:
                      s->img_buffer = pbVar26 + 1;
                      bVar28 = *pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                        pbVar31 = s->img_buffer_end;
                        goto LAB_0016380c;
                      }
                      bVar28 = 0;
                    }
                    data_00[lVar34 + 1] = bVar28;
                    if (pbVar26 < pbVar31) {
LAB_00163848:
                      s->img_buffer = pbVar26 + 1;
                      bVar28 = *pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                        goto LAB_00163848;
                      }
                      bVar28 = 0;
                    }
                    data_00[lVar34] = bVar28;
                    bVar28 = 0xff;
                    if (bVar7) {
                      if (s->img_buffer_end <= pbVar26) {
                        if (s->read_from_callbacks == 0) {
                          bVar28 = 0;
                          goto LAB_0016389f;
                        }
                        stbi__refill_buffer(s);
                        pbVar26 = s->img_buffer;
                      }
                      s->img_buffer = pbVar26 + 1;
                      bVar28 = *pbVar26;
                      pbVar26 = pbVar26 + 1;
                    }
LAB_0016389f:
                    uVar40 = lVar34 + 3;
                    if (iVar12 == 4) {
                      data_00[lVar34 + 3] = bVar28;
                      uVar40 = (ulong)((int)uVar42 + 4);
                    }
                    local_8990 = local_8990 | bVar28;
                    iVar37 = iVar37 + 1;
                    uVar42 = uVar40 & 0xffffffff;
                  } while (iVar37 < (int)s->img_x);
                }
                stbi__skip(s,local_893c);
                iVar158 = iVar158 + 1;
                sVar15 = s->img_y;
                uVar42 = uVar40 & 0xffffffff;
              } while (iVar158 < (int)sVar15);
            }
LAB_00164248:
            auVar81 = _DAT_001a60c0;
            auVar128 = _DAT_001a60b0;
            auVar77 = _DAT_001a60a0;
            auVar56 = _DAT_001a6090;
            auVar130 = _DAT_001a6080;
            auVar47 = _DAT_001a6070;
            auVar124 = _DAT_001a4410;
            if (((iVar12 == 4) && (local_8990 == 0)) &&
               (uVar17 = s->img_x * sVar15 * 4 - 1, -1 < (int)uVar17)) {
              uVar33 = uVar17 >> 2;
              auVar82._4_4_ = 0;
              auVar82._0_4_ = uVar33;
              auVar82._8_4_ = uVar33;
              auVar82._12_4_ = 0;
              puVar27 = data_00 + uVar17;
              uVar42 = 0;
              auVar51._8_4_ = 0xffffffff;
              auVar51._0_8_ = 0xffffffffffffffff;
              auVar51._12_4_ = 0xffffffff;
              do {
                auVar131._8_4_ = (int)uVar42;
                auVar131._0_8_ = uVar42;
                auVar131._12_4_ = (int)(uVar42 >> 0x20);
                auVar133 = auVar82 | auVar124;
                auVar135 = (auVar131 | auVar81) ^ auVar124;
                iVar35 = auVar133._0_4_;
                iVar154 = -(uint)(iVar35 < auVar135._0_4_);
                iVar14 = auVar133._4_4_;
                auVar137._4_4_ = -(uint)(iVar14 < auVar135._4_4_);
                iVar38 = auVar133._8_4_;
                iVar158 = -(uint)(iVar38 < auVar135._8_4_);
                iVar18 = auVar133._12_4_;
                auVar137._12_4_ = -(uint)(iVar18 < auVar135._12_4_);
                auVar147._4_4_ = iVar154;
                auVar147._0_4_ = iVar154;
                auVar147._8_4_ = iVar158;
                auVar147._12_4_ = iVar158;
                auVar133 = pshuflw(in_XMM1,auVar147,0xe8);
                auVar136._4_4_ = -(uint)(auVar135._4_4_ == iVar14);
                auVar136._12_4_ = -(uint)(auVar135._12_4_ == iVar18);
                auVar136._0_4_ = auVar136._4_4_;
                auVar136._8_4_ = auVar136._12_4_;
                auVar71 = pshuflw(in_XMM2,auVar136,0xe8);
                auVar137._0_4_ = auVar137._4_4_;
                auVar137._8_4_ = auVar137._12_4_;
                auVar135 = pshuflw(auVar133,auVar137,0xe8);
                auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar51;
                auVar133 = packssdw(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar27 = 0xff;
                }
                auVar137 = auVar136 & auVar147 | auVar137;
                auVar133 = packssdw(auVar137,auVar137);
                auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._0_4_ >> 8 & 1) != 0) {
                  puVar27[-4] = 0xff;
                }
                auVar133 = (auVar131 | auVar128) ^ auVar124;
                auVar135._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar135._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar135._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar135._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar71._4_4_ = auVar135._0_4_;
                auVar71._0_4_ = auVar135._0_4_;
                auVar71._8_4_ = auVar135._8_4_;
                auVar71._12_4_ = auVar135._8_4_;
                iVar154 = -(uint)(auVar133._4_4_ == iVar14);
                iVar158 = -(uint)(auVar133._12_4_ == iVar18);
                auVar148._4_4_ = iVar154;
                auVar148._0_4_ = iVar154;
                auVar148._8_4_ = iVar158;
                auVar148._12_4_ = iVar158;
                auVar155._4_4_ = auVar135._4_4_;
                auVar155._0_4_ = auVar135._4_4_;
                auVar155._8_4_ = auVar135._12_4_;
                auVar155._12_4_ = auVar135._12_4_;
                auVar133 = auVar148 & auVar71 | auVar155;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._0_4_ >> 0x10 & 1) != 0) {
                  puVar27[-8] = 0xff;
                }
                auVar133 = pshufhw(auVar133,auVar71,0x84);
                auVar71 = pshufhw(auVar135,auVar148,0x84);
                auVar135 = pshufhw(auVar133,auVar155,0x84);
                auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar51;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._0_4_ >> 0x18 & 1) != 0) {
                  puVar27[-0xc] = 0xff;
                }
                auVar133 = (auVar131 | auVar77) ^ auVar124;
                auVar72._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar72._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar72._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar72._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar149._4_4_ = auVar72._0_4_;
                auVar149._0_4_ = auVar72._0_4_;
                auVar149._8_4_ = auVar72._8_4_;
                auVar149._12_4_ = auVar72._8_4_;
                auVar71 = pshuflw(auVar155,auVar149,0xe8);
                auVar53._0_4_ = -(uint)(auVar133._0_4_ == iVar35);
                auVar53._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                auVar53._8_4_ = -(uint)(auVar133._8_4_ == iVar38);
                auVar53._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                auVar138._4_4_ = auVar53._4_4_;
                auVar138._0_4_ = auVar53._4_4_;
                auVar138._8_4_ = auVar53._12_4_;
                auVar138._12_4_ = auVar53._12_4_;
                auVar133 = pshuflw(auVar53,auVar138,0xe8);
                auVar139._4_4_ = auVar72._4_4_;
                auVar139._0_4_ = auVar72._4_4_;
                auVar139._8_4_ = auVar72._12_4_;
                auVar139._12_4_ = auVar72._12_4_;
                auVar135 = pshuflw(auVar72,auVar139,0xe8);
                auVar133 = packssdw(auVar133 & auVar71,(auVar135 | auVar133 & auVar71) ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar27[-0x10] = 0xff;
                }
                auVar139 = auVar138 & auVar149 | auVar139;
                auVar135 = packssdw(auVar139,auVar139);
                auVar133 = packssdw(auVar133,auVar135 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._4_2_ >> 8 & 1) != 0) {
                  puVar27[-0x14] = 0xff;
                }
                auVar133 = (auVar131 | auVar56) ^ auVar124;
                auVar73._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar73._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar73._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar73._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar140._4_4_ = auVar73._0_4_;
                auVar140._0_4_ = auVar73._0_4_;
                auVar140._8_4_ = auVar73._8_4_;
                auVar140._12_4_ = auVar73._8_4_;
                iVar154 = -(uint)(auVar133._4_4_ == iVar14);
                iVar158 = -(uint)(auVar133._12_4_ == iVar18);
                auVar150._4_4_ = iVar154;
                auVar150._0_4_ = iVar154;
                auVar150._8_4_ = iVar158;
                auVar150._12_4_ = iVar158;
                auVar156._4_4_ = auVar73._4_4_;
                auVar156._0_4_ = auVar73._4_4_;
                auVar156._8_4_ = auVar73._12_4_;
                auVar156._12_4_ = auVar73._12_4_;
                auVar133 = auVar150 & auVar140 | auVar156;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar27[-0x18] = 0xff;
                }
                auVar133 = pshufhw(auVar133,auVar140,0x84);
                auVar71 = pshufhw(auVar73,auVar150,0x84);
                auVar135 = pshufhw(auVar133,auVar156,0x84);
                auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar51;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._6_2_ >> 8 & 1) != 0) {
                  puVar27[-0x1c] = 0xff;
                }
                auVar133 = (auVar131 | auVar130) ^ auVar124;
                auVar74._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar74._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar74._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar74._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar151._4_4_ = auVar74._0_4_;
                auVar151._0_4_ = auVar74._0_4_;
                auVar151._8_4_ = auVar74._8_4_;
                auVar151._12_4_ = auVar74._8_4_;
                auVar71 = pshuflw(auVar156,auVar151,0xe8);
                auVar54._0_4_ = -(uint)(auVar133._0_4_ == iVar35);
                auVar54._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                auVar54._8_4_ = -(uint)(auVar133._8_4_ == iVar38);
                auVar54._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                auVar141._4_4_ = auVar54._4_4_;
                auVar141._0_4_ = auVar54._4_4_;
                auVar141._8_4_ = auVar54._12_4_;
                auVar141._12_4_ = auVar54._12_4_;
                auVar133 = pshuflw(auVar54,auVar141,0xe8);
                auVar142._4_4_ = auVar74._4_4_;
                auVar142._0_4_ = auVar74._4_4_;
                auVar142._8_4_ = auVar74._12_4_;
                auVar142._12_4_ = auVar74._12_4_;
                auVar135 = pshuflw(auVar74,auVar142,0xe8);
                auVar135 = (auVar135 | auVar133 & auVar71) ^ auVar51;
                auVar135 = packssdw(auVar135,auVar135);
                auVar133 = packsswb(auVar133 & auVar71,auVar135);
                if ((auVar133 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar27[-0x20] = 0xff;
                }
                auVar142 = auVar141 & auVar151 | auVar142;
                auVar135 = packssdw(auVar142,auVar142);
                auVar135 = packssdw(auVar135 ^ auVar51,auVar135 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar135);
                if ((auVar133._8_2_ >> 8 & 1) != 0) {
                  puVar27[-0x24] = 0xff;
                }
                auVar133 = (auVar131 | auVar47) ^ auVar124;
                auVar75._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar75._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar75._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar75._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar143._4_4_ = auVar75._0_4_;
                auVar143._0_4_ = auVar75._0_4_;
                auVar143._8_4_ = auVar75._8_4_;
                auVar143._12_4_ = auVar75._8_4_;
                iVar154 = -(uint)(auVar133._4_4_ == iVar14);
                iVar158 = -(uint)(auVar133._12_4_ == iVar18);
                auVar152._4_4_ = iVar154;
                auVar152._0_4_ = iVar154;
                auVar152._8_4_ = iVar158;
                auVar152._12_4_ = iVar158;
                auVar157._4_4_ = auVar75._4_4_;
                auVar157._0_4_ = auVar75._4_4_;
                auVar157._8_4_ = auVar75._12_4_;
                auVar157._12_4_ = auVar75._12_4_;
                auVar133 = auVar152 & auVar143 | auVar157;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar27[-0x28] = 0xff;
                }
                auVar133 = pshufhw(auVar133,auVar143,0x84);
                auVar71 = pshufhw(auVar75,auVar152,0x84);
                auVar135 = pshufhw(auVar133,auVar157,0x84);
                auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar51;
                auVar133 = packssdw(auVar133,auVar133);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._10_2_ >> 8 & 1) != 0) {
                  puVar27[-0x2c] = 0xff;
                }
                auVar133 = (auVar131 | _DAT_001a6060) ^ auVar124;
                auVar76._0_4_ = -(uint)(iVar35 < auVar133._0_4_);
                auVar76._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                auVar76._8_4_ = -(uint)(iVar38 < auVar133._8_4_);
                auVar76._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                auVar153._4_4_ = auVar76._0_4_;
                auVar153._0_4_ = auVar76._0_4_;
                auVar153._8_4_ = auVar76._8_4_;
                auVar153._12_4_ = auVar76._8_4_;
                auVar71 = pshuflw(auVar157,auVar153,0xe8);
                auVar55._0_4_ = -(uint)(auVar133._0_4_ == iVar35);
                auVar55._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                auVar55._8_4_ = -(uint)(auVar133._8_4_ == iVar38);
                auVar55._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                auVar144._4_4_ = auVar55._4_4_;
                auVar144._0_4_ = auVar55._4_4_;
                auVar144._8_4_ = auVar55._12_4_;
                auVar144._12_4_ = auVar55._12_4_;
                auVar133 = pshuflw(auVar55,auVar144,0xe8);
                auVar145._4_4_ = auVar76._4_4_;
                auVar145._0_4_ = auVar76._4_4_;
                auVar145._8_4_ = auVar76._12_4_;
                auVar145._12_4_ = auVar76._12_4_;
                auVar135 = pshuflw(auVar76,auVar145,0xe8);
                auVar133 = packssdw(auVar133 & auVar71,(auVar135 | auVar133 & auVar71) ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar27[-0x30] = 0xff;
                }
                auVar145 = auVar144 & auVar153 | auVar145;
                auVar135 = packssdw(auVar145,auVar145);
                auVar133 = packssdw(auVar133,auVar135 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133._12_2_ >> 8 & 1) != 0) {
                  puVar27[-0x34] = 0xff;
                }
                auVar135 = (auVar131 | _DAT_001a6050) ^ auVar124;
                auVar133._0_4_ = -(uint)(iVar35 < auVar135._0_4_);
                auVar133._4_4_ = -(uint)(iVar14 < auVar135._4_4_);
                auVar133._8_4_ = -(uint)(iVar38 < auVar135._8_4_);
                auVar133._12_4_ = -(uint)(iVar18 < auVar135._12_4_);
                auVar146._4_4_ = auVar133._0_4_;
                auVar146._0_4_ = auVar133._0_4_;
                auVar146._8_4_ = auVar133._8_4_;
                auVar146._12_4_ = auVar133._8_4_;
                auVar132._4_4_ = -(uint)(auVar135._4_4_ == iVar14);
                auVar132._12_4_ = -(uint)(auVar135._12_4_ == iVar18);
                auVar132._0_4_ = auVar132._4_4_;
                auVar132._8_4_ = auVar132._12_4_;
                auVar134._4_4_ = auVar133._4_4_;
                auVar134._0_4_ = auVar133._4_4_;
                auVar134._8_4_ = auVar133._12_4_;
                auVar134._12_4_ = auVar133._12_4_;
                auVar135 = auVar132 & auVar146 | auVar134;
                auVar133 = packssdw(auVar133,auVar135);
                auVar133 = packssdw(auVar133 ^ auVar51,auVar133 ^ auVar51);
                auVar133 = packsswb(auVar133,auVar133);
                if ((auVar133 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar27[-0x38] = 0xff;
                }
                auVar133 = pshufhw(auVar133,auVar146,0x84);
                in_XMM2 = pshufhw(auVar135,auVar132,0x84);
                in_XMM2 = in_XMM2 & auVar133;
                auVar133 = pshufhw(auVar133,auVar134,0x84);
                auVar133 = (auVar133 | in_XMM2) ^ auVar51;
                auVar133 = packssdw(auVar133,auVar133);
                in_XMM1 = packsswb(auVar133,auVar133);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  puVar27[-0x3c] = 0xff;
                }
                uVar42 = uVar42 + 0x10;
                puVar27 = puVar27 + -0x40;
              } while ((uVar33 + 0x10 & 0x3ffffff0) != uVar42);
            }
            if ((int)uVar13 < 1) {
              uVar13 = s->img_x;
            }
            else {
              uVar13 = s->img_x;
              if (0 < (int)sVar15 >> 1) {
                uVar17 = uVar13 * iVar12;
                uVar33 = (sVar15 - 1) * uVar17;
                uVar42 = 0;
                uVar40 = 0;
                do {
                  if (0 < (int)uVar17) {
                    uVar36 = 0;
                    do {
                      uVar2 = data_00[uVar36 + uVar42];
                      data_00[uVar36 + uVar42] = data_00[uVar36 + uVar33];
                      data_00[uVar36 + uVar33] = uVar2;
                      uVar36 = uVar36 + 1;
                    } while (uVar17 != uVar36);
                  }
                  uVar40 = uVar40 + 1;
                  uVar33 = uVar33 - uVar17;
                  uVar42 = (ulong)((int)uVar42 + uVar17);
                } while (uVar40 != (uint)((int)sVar15 >> 1));
              }
            }
            if ((req_comp != 0) && (iVar12 != req_comp)) {
              data_00 = stbi__convert_format(data_00,iVar12,req_comp,uVar13,sVar15);
              if (data_00 == (uchar *)0x0) {
                return (void *)0x0;
              }
              uVar13 = s->img_x;
            }
            *x = uVar13;
            *y = s->img_y;
            if (comp != (int *)0x0) {
              *comp = s->img_n;
              return data_00;
            }
            return data_00;
          }
          local_893c = s->img_x * 2 & 2;
LAB_001633fa:
          if ((local_88dc.mg != 0 && local_88dc.mr != 0) && local_88dc.mb != 0) {
            iVar14 = stbi__high_bit(local_88dc.mr);
            uVar17 = stbi__bitcount(local_88dc.mr);
            iVar38 = stbi__high_bit(local_88dc.mg);
            uVar33 = stbi__bitcount(local_88dc.mg);
            iVar18 = stbi__high_bit(local_88dc.mb);
            uVar19 = stbi__bitcount(local_88dc.mb);
            iVar154 = stbi__high_bit(local_88dc.ma);
            uVar29 = stbi__bitcount(local_88dc.ma);
            if ((uVar19 < 9 && (uVar33 < 9 && uVar17 < 9)) && uVar29 < 9) {
              iVar14 = iVar14 + -7;
              iVar38 = iVar38 + -7;
              iVar18 = iVar18 + -7;
              iVar154 = iVar154 + -7;
              bVar9 = true;
              bVar7 = false;
              goto LAB_00163528;
            }
          }
        }
LAB_001634c5:
        free(data_00);
        goto LAB_001634cd;
      }
      goto LAB_00163f2a;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar25 = s->img_buffer;
      goto LAB_00162888;
    }
LAB_00162a26:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00162a3a:
    iVar12 = stbi__gif_test(s);
    if (iVar12 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar30);
      if (data == (stbi__context *)0x0 || data == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      local_88a8.out = local_88a8.background;
LAB_00162cdb:
      free(local_88a8.out);
      return data;
    }
    iVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
      iVar12 = stbi__pic_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      iVar12 = stbi__jpeg_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      iVar12 = stbi__pnm_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar24;
      }
      iVar12 = stbi__hdr_test(s);
      if (iVar12 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar25 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar25;
      }
      iVar12 = stbi__tga_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      pcVar22 = "Image not of any known type, or corrupt";
      goto LAB_00162849;
    }
    iVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
      pcVar22 = "Corrupt PSD image";
      goto LAB_00162849;
    }
    iVar12 = stbi__get16be(s);
    if (iVar12 != 1) {
      pcVar22 = "Unsupported version of PSD image";
      goto LAB_00162849;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar25 = s->img_buffer;
LAB_00162da2:
      s->img_buffer = psVar25 + 6;
    }
    else {
      psVar25 = s->img_buffer;
      iVar12 = (int)s->img_buffer_end - (int)psVar25;
      if (5 < iVar12) goto LAB_00162da2;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar12);
    }
    uVar13 = stbi__get16be(s);
    if (0x10 < uVar13) {
      pcVar22 = "Unsupported number of channels in PSD image";
      goto LAB_00162849;
    }
    iVar12 = stbi__get16be(s);
    uVar29 = iVar12 * 0x10000;
    uVar17 = stbi__get16be(s);
    uVar19 = uVar29 + uVar17;
    iVar12 = stbi__get16be(s);
    uVar33 = stbi__get16be(s);
    if ((int)uVar19 < 0x1000001) {
      uVar41 = iVar12 * 0x10000;
      uVar20 = uVar41 + uVar33;
      if ((int)uVar20 < 0x1000001) {
        iVar12 = stbi__get16be(s);
        if ((iVar12 != 8) && (iVar12 != 0x10)) {
          pcVar22 = "PSD bit depth is not 8 or 16 bit";
          goto LAB_00162849;
        }
        iVar35 = stbi__get16be(s);
        if (iVar35 != 3) {
          pcVar22 = "PSD is not in RGB color format";
          goto LAB_00162849;
        }
        sVar15 = stbi__get32be(s);
        stbi__skip(s,sVar15);
        sVar15 = stbi__get32be(s);
        stbi__skip(s,sVar15);
        sVar15 = stbi__get32be(s);
        stbi__skip(s,sVar15);
        uVar16 = stbi__get16be(s);
        if (1 < uVar16) {
          pcVar22 = "PSD has an unknown compression format";
          goto LAB_00162849;
        }
        iVar35 = stbi__mad3sizes_valid(4,uVar20,uVar19,0);
        if (iVar35 == 0) {
          pcVar22 = "Corrupt PSD";
          goto LAB_00162849;
        }
        if (((bpc == 0x10) && (iVar12 == 0x10)) && (uVar16 == 0)) {
          data_02 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar20,uVar19,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          data_02 = (stbi__uint16 *)malloc((long)(int)(uVar19 * uVar20 * 4));
        }
        if (data_02 != (stbi__uint16 *)0x0) {
          iVar35 = uVar20 * uVar19;
          if (uVar16 == 0) {
            lVar34 = (ulong)((uVar17 | uVar29) * (uVar33 | uVar41)) - 1;
            auVar47._8_4_ = (int)lVar34;
            auVar47._0_8_ = lVar34;
            auVar47._12_4_ = (int)((ulong)lVar34 >> 0x20);
            psVar44 = data_02 + 0x1e;
            uVar16 = (uVar17 + uVar29) * (uVar33 + uVar41);
            psVar43 = data_02 + 0x1c;
            uVar42 = 0;
            auVar130._8_4_ = 0xffffffff;
            auVar130._0_8_ = 0xffffffffffffffff;
            auVar130._12_4_ = 0xffffffff;
            auVar124 = _DAT_001a4410;
            local_8968 = data_02;
            local_8948 = data_02;
            do {
              if (uVar42 < uVar13) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < iVar35) {
                    lVar34 = 0;
                    do {
                      iVar14 = stbi__get16be(s);
                      auVar124 = _DAT_001a4410;
                      auVar130._8_4_ = 0xffffffff;
                      auVar130._0_8_ = 0xffffffffffffffff;
                      auVar130._12_4_ = 0xffffffff;
                      local_8968[lVar34 * 4] = (stbi__uint16)iVar14;
                      lVar34 = lVar34 + 1;
                    } while (uVar16 != (uint)lVar34);
                  }
                }
                else if (iVar12 == 0x10) {
                  if (0 < iVar35) {
                    lVar34 = 0;
                    do {
                      iVar14 = stbi__get16be(s);
                      auVar124 = _DAT_001a4410;
                      auVar130._8_4_ = 0xffffffff;
                      auVar130._0_8_ = 0xffffffffffffffff;
                      auVar130._12_4_ = 0xffffffff;
                      *(char *)(local_8948 + lVar34 * 2) = (char)((uint)iVar14 >> 8);
                      lVar34 = lVar34 + 1;
                    } while (uVar16 - (int)lVar34 != 0);
                  }
                }
                else if (0 < iVar35) {
                  psVar25 = s->img_buffer;
                  lVar34 = 0;
                  do {
                    if (psVar25 < s->img_buffer_end) {
LAB_001650bb:
                      s->img_buffer = psVar25 + 1;
                      sVar32 = *psVar25;
                      psVar25 = psVar25 + 1;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        auVar130._8_4_ = 0xffffffff;
                        auVar130._0_8_ = 0xffffffffffffffff;
                        auVar130._12_4_ = 0xffffffff;
                        psVar25 = s->img_buffer;
                        auVar124 = _DAT_001a4410;
                        goto LAB_001650bb;
                      }
                      sVar32 = '\0';
                    }
                    *(stbi_uc *)(local_8948 + lVar34 * 2) = sVar32;
                    lVar34 = lVar34 + 1;
                  } while (uVar16 - (int)lVar34 != 0);
                }
              }
              else if (iVar12 == 0x10 && bpc == 0x10) {
                if (0 < iVar35) {
                  sVar11 = -(ushort)(uVar42 == 3);
                  uVar40 = 0;
                  do {
                    auVar48._8_4_ = (int)uVar40;
                    auVar48._0_8_ = uVar40;
                    auVar48._12_4_ = (int)(uVar40 >> 0x20);
                    auVar56 = auVar47 ^ auVar124;
                    auVar77 = (auVar48 | _DAT_001a60c0) ^ auVar124;
                    iVar14 = auVar56._0_4_;
                    iVar158 = -(uint)(iVar14 < auVar77._0_4_);
                    iVar38 = auVar56._4_4_;
                    auVar79._4_4_ = -(uint)(iVar38 < auVar77._4_4_);
                    iVar18 = auVar56._8_4_;
                    iVar37 = -(uint)(iVar18 < auVar77._8_4_);
                    iVar154 = auVar56._12_4_;
                    auVar79._12_4_ = -(uint)(iVar154 < auVar77._12_4_);
                    auVar104._4_4_ = iVar158;
                    auVar104._0_4_ = iVar158;
                    auVar104._8_4_ = iVar37;
                    auVar104._12_4_ = iVar37;
                    auVar56 = pshuflw(in_XMM5,auVar104,0xe8);
                    auVar78._4_4_ = -(uint)(auVar77._4_4_ == iVar38);
                    auVar78._12_4_ = -(uint)(auVar77._12_4_ == iVar154);
                    auVar78._0_4_ = auVar78._4_4_;
                    auVar78._8_4_ = auVar78._12_4_;
                    auVar128 = pshuflw(in_XMM6,auVar78,0xe8);
                    auVar79._0_4_ = auVar79._4_4_;
                    auVar79._8_4_ = auVar79._12_4_;
                    auVar77 = pshuflw(auVar56,auVar79,0xe8);
                    auVar77 = (auVar77 | auVar128 & auVar56) ^ auVar130;
                    auVar77 = packssdw(auVar77,auVar77);
                    if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xffffffffffffffe4] = sVar11;
                    }
                    auVar79 = auVar78 & auVar104 | auVar79;
                    auVar77 = packssdw(auVar79,auVar79);
                    auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                    if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
                      psVar43[uVar40 * 4 + 0xffffffffffffffe8] = sVar11;
                    }
                    auVar77 = (auVar48 | _DAT_001a60b0) ^ auVar124;
                    iVar158 = -(uint)(iVar14 < auVar77._0_4_);
                    auVar120._4_4_ = -(uint)(iVar38 < auVar77._4_4_);
                    iVar37 = -(uint)(iVar18 < auVar77._8_4_);
                    auVar120._12_4_ = -(uint)(iVar154 < auVar77._12_4_);
                    auVar80._4_4_ = iVar158;
                    auVar80._0_4_ = iVar158;
                    auVar80._8_4_ = iVar37;
                    auVar80._12_4_ = iVar37;
                    auVar105._4_4_ = -(uint)(auVar77._4_4_ == iVar38);
                    auVar105._12_4_ = -(uint)(auVar77._12_4_ == iVar154);
                    auVar105._0_4_ = auVar105._4_4_;
                    auVar105._8_4_ = auVar105._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar77 = auVar105 & auVar80 | auVar120;
                    auVar77 = packssdw(auVar77,auVar77);
                    auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                    if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xffffffffffffffec] = sVar11;
                    }
                    auVar81 = pshufhw(auVar80,auVar80,0x84);
                    auVar51 = pshufhw(auVar105,auVar105,0x84);
                    auVar82 = pshufhw(auVar81,auVar120,0x84);
                    auVar81 = (auVar82 | auVar51 & auVar81) ^ auVar130;
                    auVar81 = packssdw(auVar81,auVar81);
                    if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xfffffffffffffff0] = sVar11;
                    }
                    auVar81 = (auVar48 | _DAT_001a60a0) ^ auVar124;
                    iVar158 = -(uint)(iVar14 < auVar81._0_4_);
                    auVar84._4_4_ = -(uint)(iVar38 < auVar81._4_4_);
                    iVar37 = -(uint)(iVar18 < auVar81._8_4_);
                    auVar84._12_4_ = -(uint)(iVar154 < auVar81._12_4_);
                    auVar106._4_4_ = iVar158;
                    auVar106._0_4_ = iVar158;
                    auVar106._8_4_ = iVar37;
                    auVar106._12_4_ = iVar37;
                    auVar77 = pshuflw(auVar77,auVar106,0xe8);
                    auVar83._4_4_ = -(uint)(auVar81._4_4_ == iVar38);
                    auVar83._12_4_ = -(uint)(auVar81._12_4_ == iVar154);
                    auVar83._0_4_ = auVar83._4_4_;
                    auVar83._8_4_ = auVar83._12_4_;
                    in_XMM6 = pshuflw(auVar128 & auVar56,auVar83,0xe8);
                    in_XMM6 = in_XMM6 & auVar77;
                    auVar84._0_4_ = auVar84._4_4_;
                    auVar84._8_4_ = auVar84._12_4_;
                    auVar56 = pshuflw(auVar77,auVar84,0xe8);
                    auVar56 = (auVar56 | in_XMM6) ^ auVar130;
                    in_XMM5 = packssdw(auVar56,auVar56);
                    if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xfffffffffffffff4] = sVar11;
                    }
                    auVar84 = auVar83 & auVar106 | auVar84;
                    auVar56 = packssdw(auVar84,auVar84);
                    auVar56 = packssdw(auVar56 ^ auVar130,auVar56 ^ auVar130);
                    if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xfffffffffffffff8] = sVar11;
                    }
                    auVar56 = (auVar48 | _DAT_001a6090) ^ auVar124;
                    auVar107._0_4_ = -(uint)(iVar14 < auVar56._0_4_);
                    auVar107._4_4_ = -(uint)(iVar38 < auVar56._4_4_);
                    auVar107._8_4_ = -(uint)(iVar18 < auVar56._8_4_);
                    auVar107._12_4_ = -(uint)(iVar154 < auVar56._12_4_);
                    auVar85._4_4_ = auVar107._0_4_;
                    auVar85._0_4_ = auVar107._0_4_;
                    auVar85._8_4_ = auVar107._8_4_;
                    auVar85._12_4_ = auVar107._8_4_;
                    auVar49._4_4_ = -(uint)(auVar56._4_4_ == iVar38);
                    auVar49._12_4_ = -(uint)(auVar56._12_4_ == iVar154);
                    auVar49._0_4_ = auVar49._4_4_;
                    auVar49._8_4_ = auVar49._12_4_;
                    auVar57._4_4_ = auVar107._4_4_;
                    auVar57._0_4_ = auVar107._4_4_;
                    auVar57._8_4_ = auVar107._12_4_;
                    auVar57._12_4_ = auVar107._12_4_;
                    auVar56 = packssdw(auVar107,auVar49 & auVar85 | auVar57);
                    auVar56 = packssdw(auVar56 ^ auVar130,auVar56 ^ auVar130);
                    if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4 + 0xfffffffffffffffc] = sVar11;
                    }
                    auVar128 = pshufhw(auVar85,auVar85,0x84);
                    auVar56 = pshufhw(auVar49,auVar49,0x84);
                    auVar77 = pshufhw(auVar57,auVar57,0x84);
                    auVar56 = packssdw(auVar56 & auVar128,(auVar77 | auVar56 & auVar128) ^ auVar130)
                    ;
                    if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      psVar43[uVar40 * 4] = sVar11;
                    }
                    uVar40 = uVar40 + 8;
                  } while (((ulong)uVar16 + 7 & 0xfffffffffffffff8) != uVar40);
                }
              }
              else if (0 < iVar35) {
                cVar10 = -(uVar42 == 3);
                uVar40 = 0;
                do {
                  auVar56._8_4_ = (int)uVar40;
                  auVar56._0_8_ = uVar40;
                  auVar56._12_4_ = (int)(uVar40 >> 0x20);
                  auVar77 = auVar47 ^ auVar124;
                  auVar128 = (auVar56 | _DAT_001a60c0) ^ auVar124;
                  iVar14 = auVar77._0_4_;
                  iVar158 = -(uint)(iVar14 < auVar128._0_4_);
                  iVar38 = auVar77._4_4_;
                  auVar81._4_4_ = -(uint)(iVar38 < auVar128._4_4_);
                  iVar18 = auVar77._8_4_;
                  iVar37 = -(uint)(iVar18 < auVar128._8_4_);
                  iVar154 = auVar77._12_4_;
                  auVar81._12_4_ = -(uint)(iVar154 < auVar128._12_4_);
                  auVar108._4_4_ = iVar158;
                  auVar108._0_4_ = iVar158;
                  auVar108._8_4_ = iVar37;
                  auVar108._12_4_ = iVar37;
                  auVar82 = pshuflw(in_XMM5,auVar108,0xe8);
                  auVar77._4_4_ = -(uint)(auVar128._4_4_ == iVar38);
                  auVar77._12_4_ = -(uint)(auVar128._12_4_ == iVar154);
                  auVar77._0_4_ = auVar77._4_4_;
                  auVar77._8_4_ = auVar77._12_4_;
                  auVar51 = pshuflw(in_XMM6,auVar77,0xe8);
                  auVar81._0_4_ = auVar81._4_4_;
                  auVar81._8_4_ = auVar81._12_4_;
                  auVar128 = pshuflw(auVar82,auVar81,0xe8);
                  auVar128 = (auVar128 | auVar51 & auVar82) ^ auVar130;
                  auVar128 = packssdw(auVar128,auVar128);
                  if ((auVar128 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffe2) = cVar10;
                  }
                  auVar81 = auVar77 & auVar108 | auVar81;
                  auVar77 = packssdw(auVar81,auVar81);
                  auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77._0_4_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffe4) = cVar10;
                  }
                  auVar77 = (auVar56 | _DAT_001a60b0) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar77._0_4_);
                  auVar121._4_4_ = -(uint)(iVar38 < auVar77._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar77._8_4_);
                  auVar121._12_4_ = -(uint)(iVar154 < auVar77._12_4_);
                  auVar128._4_4_ = iVar158;
                  auVar128._0_4_ = iVar158;
                  auVar128._8_4_ = iVar37;
                  auVar128._12_4_ = iVar37;
                  auVar109._4_4_ = -(uint)(auVar77._4_4_ == iVar38);
                  auVar109._12_4_ = -(uint)(auVar77._12_4_ == iVar154);
                  auVar109._0_4_ = auVar109._4_4_;
                  auVar109._8_4_ = auVar109._12_4_;
                  auVar121._0_4_ = auVar121._4_4_;
                  auVar121._8_4_ = auVar121._12_4_;
                  auVar77 = auVar109 & auVar128 | auVar121;
                  auVar77 = packssdw(auVar77,auVar77);
                  auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffe6) = cVar10;
                  }
                  auVar128 = pshufhw(auVar128,auVar128,0x84);
                  auVar133 = pshufhw(auVar109,auVar109,0x84);
                  auVar81 = pshufhw(auVar128,auVar121,0x84);
                  auVar128 = (auVar81 | auVar133 & auVar128) ^ auVar130;
                  auVar128 = packssdw(auVar128,auVar128);
                  auVar128 = packsswb(auVar128,auVar128);
                  if ((auVar128._0_4_ >> 0x18 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffe8) = cVar10;
                  }
                  auVar128 = (auVar56 | _DAT_001a60a0) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar128._0_4_);
                  auVar87._4_4_ = -(uint)(iVar38 < auVar128._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar128._8_4_);
                  auVar87._12_4_ = -(uint)(iVar154 < auVar128._12_4_);
                  auVar110._4_4_ = iVar158;
                  auVar110._0_4_ = iVar158;
                  auVar110._8_4_ = iVar37;
                  auVar110._12_4_ = iVar37;
                  auVar77 = pshuflw(auVar77,auVar110,0xe8);
                  auVar86._4_4_ = -(uint)(auVar128._4_4_ == iVar38);
                  auVar86._12_4_ = -(uint)(auVar128._12_4_ == iVar154);
                  auVar86._0_4_ = auVar86._4_4_;
                  auVar86._8_4_ = auVar86._12_4_;
                  auVar81 = pshuflw(auVar51 & auVar82,auVar86,0xe8);
                  auVar87._0_4_ = auVar87._4_4_;
                  auVar87._8_4_ = auVar87._12_4_;
                  auVar128 = pshuflw(auVar77,auVar87,0xe8);
                  auVar128 = (auVar128 | auVar81 & auVar77) ^ auVar130;
                  auVar128 = packssdw(auVar128,auVar128);
                  auVar128 = packsswb(auVar128,auVar128);
                  if ((auVar128 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffea) = cVar10;
                  }
                  auVar87 = auVar86 & auVar110 | auVar87;
                  auVar128 = packssdw(auVar87,auVar87);
                  auVar128 = packssdw(auVar128 ^ auVar130,auVar128 ^ auVar130);
                  auVar128 = packsswb(auVar128,auVar128);
                  if ((auVar128._4_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffec) = cVar10;
                  }
                  auVar128 = (auVar56 | _DAT_001a6090) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar128._0_4_);
                  auVar122._4_4_ = -(uint)(iVar38 < auVar128._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar128._8_4_);
                  auVar122._12_4_ = -(uint)(iVar154 < auVar128._12_4_);
                  auVar88._4_4_ = iVar158;
                  auVar88._0_4_ = iVar158;
                  auVar88._8_4_ = iVar37;
                  auVar88._12_4_ = iVar37;
                  auVar111._4_4_ = -(uint)(auVar128._4_4_ == iVar38);
                  auVar111._12_4_ = -(uint)(auVar128._12_4_ == iVar154);
                  auVar111._0_4_ = auVar111._4_4_;
                  auVar111._8_4_ = auVar111._12_4_;
                  auVar122._0_4_ = auVar122._4_4_;
                  auVar122._8_4_ = auVar122._12_4_;
                  auVar128 = auVar111 & auVar88 | auVar122;
                  auVar128 = packssdw(auVar128,auVar128);
                  auVar128 = packssdw(auVar128 ^ auVar130,auVar128 ^ auVar130);
                  auVar128 = packsswb(auVar128,auVar128);
                  if ((auVar128 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xffffffffffffffee) = cVar10;
                  }
                  auVar82 = pshufhw(auVar88,auVar88,0x84);
                  auVar133 = pshufhw(auVar111,auVar111,0x84);
                  auVar51 = pshufhw(auVar82,auVar122,0x84);
                  auVar82 = (auVar51 | auVar133 & auVar82) ^ auVar130;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._6_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffff0) = cVar10;
                  }
                  auVar82 = (auVar56 | _DAT_001a6080) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar82._0_4_);
                  auVar90._4_4_ = -(uint)(iVar38 < auVar82._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar82._8_4_);
                  auVar90._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                  auVar112._4_4_ = iVar158;
                  auVar112._0_4_ = iVar158;
                  auVar112._8_4_ = iVar37;
                  auVar112._12_4_ = iVar37;
                  auVar128 = pshuflw(auVar128,auVar112,0xe8);
                  auVar89._4_4_ = -(uint)(auVar82._4_4_ == iVar38);
                  auVar89._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                  auVar89._0_4_ = auVar89._4_4_;
                  auVar89._8_4_ = auVar89._12_4_;
                  auVar81 = pshuflw(auVar81 & auVar77,auVar89,0xe8);
                  auVar90._0_4_ = auVar90._4_4_;
                  auVar90._8_4_ = auVar90._12_4_;
                  auVar77 = pshuflw(auVar128,auVar90,0xe8);
                  auVar77 = (auVar77 | auVar81 & auVar128) ^ auVar130;
                  auVar77 = packssdw(auVar77,auVar77);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffff2) = cVar10;
                  }
                  auVar90 = auVar89 & auVar112 | auVar90;
                  auVar77 = packssdw(auVar90,auVar90);
                  auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77._8_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffff4) = cVar10;
                  }
                  auVar77 = (auVar56 | _DAT_001a6070) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar77._0_4_);
                  auVar123._4_4_ = -(uint)(iVar38 < auVar77._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar77._8_4_);
                  auVar123._12_4_ = -(uint)(iVar154 < auVar77._12_4_);
                  auVar91._4_4_ = iVar158;
                  auVar91._0_4_ = iVar158;
                  auVar91._8_4_ = iVar37;
                  auVar91._12_4_ = iVar37;
                  auVar113._4_4_ = -(uint)(auVar77._4_4_ == iVar38);
                  auVar113._12_4_ = -(uint)(auVar77._12_4_ == iVar154);
                  auVar113._0_4_ = auVar113._4_4_;
                  auVar113._8_4_ = auVar113._12_4_;
                  auVar123._0_4_ = auVar123._4_4_;
                  auVar123._8_4_ = auVar123._12_4_;
                  auVar77 = auVar113 & auVar91 | auVar123;
                  auVar77 = packssdw(auVar77,auVar77);
                  auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffff6) = cVar10;
                  }
                  auVar82 = pshufhw(auVar91,auVar91,0x84);
                  auVar133 = pshufhw(auVar113,auVar113,0x84);
                  auVar51 = pshufhw(auVar82,auVar123,0x84);
                  auVar82 = (auVar51 | auVar133 & auVar82) ^ auVar130;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._10_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffff8) = cVar10;
                  }
                  auVar82 = (auVar56 | _DAT_001a6060) ^ auVar124;
                  iVar158 = -(uint)(iVar14 < auVar82._0_4_);
                  auVar93._4_4_ = -(uint)(iVar38 < auVar82._4_4_);
                  iVar37 = -(uint)(iVar18 < auVar82._8_4_);
                  auVar93._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                  auVar114._4_4_ = iVar158;
                  auVar114._0_4_ = iVar158;
                  auVar114._8_4_ = iVar37;
                  auVar114._12_4_ = iVar37;
                  auVar77 = pshuflw(auVar77,auVar114,0xe8);
                  auVar92._4_4_ = -(uint)(auVar82._4_4_ == iVar38);
                  auVar92._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                  auVar92._0_4_ = auVar92._4_4_;
                  auVar92._8_4_ = auVar92._12_4_;
                  in_XMM6 = pshuflw(auVar81 & auVar128,auVar92,0xe8);
                  in_XMM6 = in_XMM6 & auVar77;
                  auVar93._0_4_ = auVar93._4_4_;
                  auVar93._8_4_ = auVar93._12_4_;
                  auVar77 = pshuflw(auVar77,auVar93,0xe8);
                  auVar77 = (auVar77 | in_XMM6) ^ auVar130;
                  auVar77 = packssdw(auVar77,auVar77);
                  in_XMM5 = packsswb(auVar77,auVar77);
                  if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffffa) = cVar10;
                  }
                  auVar93 = auVar92 & auVar114 | auVar93;
                  auVar77 = packssdw(auVar93,auVar93);
                  auVar77 = packssdw(auVar77 ^ auVar130,auVar77 ^ auVar130);
                  auVar77 = packsswb(auVar77,auVar77);
                  if ((auVar77._12_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffffc) = cVar10;
                  }
                  auVar56 = (auVar56 | _DAT_001a6050) ^ auVar124;
                  auVar115._0_4_ = -(uint)(iVar14 < auVar56._0_4_);
                  auVar115._4_4_ = -(uint)(iVar38 < auVar56._4_4_);
                  auVar115._8_4_ = -(uint)(iVar18 < auVar56._8_4_);
                  auVar115._12_4_ = -(uint)(iVar154 < auVar56._12_4_);
                  auVar94._4_4_ = auVar115._0_4_;
                  auVar94._0_4_ = auVar115._0_4_;
                  auVar94._8_4_ = auVar115._8_4_;
                  auVar94._12_4_ = auVar115._8_4_;
                  auVar50._4_4_ = -(uint)(auVar56._4_4_ == iVar38);
                  auVar50._12_4_ = -(uint)(auVar56._12_4_ == iVar154);
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar58._4_4_ = auVar115._4_4_;
                  auVar58._0_4_ = auVar115._4_4_;
                  auVar58._8_4_ = auVar115._12_4_;
                  auVar58._12_4_ = auVar115._12_4_;
                  auVar56 = packssdw(auVar115,auVar50 & auVar94 | auVar58);
                  auVar56 = packssdw(auVar56 ^ auVar130,auVar56 ^ auVar130);
                  auVar56 = packsswb(auVar56,auVar56);
                  if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar44 + uVar40 * 2 + 0xfffffffffffffffe) = cVar10;
                  }
                  auVar128 = pshufhw(auVar94,auVar94,0x84);
                  auVar56 = pshufhw(auVar50,auVar50,0x84);
                  auVar77 = pshufhw(auVar58,auVar58,0x84);
                  auVar56 = packssdw(auVar56 & auVar128,(auVar77 | auVar56 & auVar128) ^ auVar130);
                  auVar56 = packsswb(auVar56,auVar56);
                  if ((auVar56._14_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar44 + uVar40 * 2) = cVar10;
                  }
                  uVar40 = uVar40 + 0x10;
                } while (((ulong)uVar16 + 0xf & 0xfffffffffffffff0) != uVar40);
              }
              uVar42 = uVar42 + 1;
              psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
              psVar43 = psVar43 + 1;
              local_8948 = (stbi__uint16 *)((long)local_8948 + 1);
              local_8968 = local_8968 + 1;
            } while (uVar42 != 4);
          }
          else {
            stbi__skip(s,uVar13 * uVar19 * 2);
            lVar34 = (ulong)((uVar17 | uVar29) * (uVar33 | uVar41)) - 1;
            auVar129._8_4_ = (int)lVar34;
            auVar129._0_8_ = lVar34;
            auVar129._12_4_ = (int)((ulong)lVar34 >> 0x20);
            psVar43 = data_02 + 0x1e;
            uVar42 = 0;
            auVar124 = _DAT_001a6050;
            auVar47 = _DAT_001a6060;
            auVar130 = _DAT_001a6070;
            auVar56 = _DAT_001a6080;
            auVar77 = _DAT_001a6090;
            auVar128 = _DAT_001a60a0;
            auVar81 = _DAT_001a60b0;
            auVar82 = _DAT_001a60c0;
            do {
              if (uVar42 < uVar13) {
                iVar12 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_02 + uVar42),iVar35);
                auVar124 = _DAT_001a6050;
                auVar47 = _DAT_001a6060;
                auVar130 = _DAT_001a6070;
                auVar56 = _DAT_001a6080;
                auVar77 = _DAT_001a6090;
                auVar128 = _DAT_001a60a0;
                auVar81 = _DAT_001a60b0;
                auVar82 = _DAT_001a60c0;
                if (iVar12 == 0) {
                  free(data_02);
                  pcVar22 = "bad RLE data";
                  goto LAB_00162849;
                }
              }
              else if (0 < iVar35) {
                cVar10 = -(uVar42 == 3);
                uVar40 = 0;
                do {
                  auVar45._8_4_ = (int)uVar40;
                  auVar45._0_8_ = uVar40;
                  auVar45._12_4_ = (int)(uVar40 >> 0x20);
                  auVar51 = auVar129 ^ _DAT_001a4410;
                  auVar133 = (auVar45 | auVar82) ^ _DAT_001a4410;
                  iVar12 = auVar51._0_4_;
                  iVar154 = -(uint)(iVar12 < auVar133._0_4_);
                  iVar14 = auVar51._4_4_;
                  auVar60._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                  iVar38 = auVar51._8_4_;
                  iVar158 = -(uint)(iVar38 < auVar133._8_4_);
                  iVar18 = auVar51._12_4_;
                  auVar60._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                  auVar96._4_4_ = iVar154;
                  auVar96._0_4_ = iVar154;
                  auVar96._8_4_ = iVar158;
                  auVar96._12_4_ = iVar158;
                  auVar51 = pshuflw(in_XMM5,auVar96,0xe8);
                  auVar59._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                  auVar59._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  auVar135 = pshuflw(in_XMM6,auVar59,0xe8);
                  auVar60._0_4_ = auVar60._4_4_;
                  auVar60._8_4_ = auVar60._12_4_;
                  auVar133 = pshuflw(auVar51,auVar60,0xe8);
                  auVar125._8_4_ = 0xffffffff;
                  auVar125._0_8_ = 0xffffffffffffffff;
                  auVar125._12_4_ = 0xffffffff;
                  auVar51 = (auVar133 | auVar135 & auVar51) ^ auVar125;
                  auVar51 = packssdw(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffe2) = cVar10;
                  }
                  auVar60 = auVar59 & auVar96 | auVar60;
                  auVar51 = packssdw(auVar60,auVar60);
                  auVar51 = packssdw(auVar51 ^ auVar125,auVar51 ^ auVar125);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._0_4_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffe4) = cVar10;
                  }
                  auVar51 = (auVar45 | auVar81) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar51._0_4_);
                  auVar117._4_4_ = -(uint)(iVar14 < auVar51._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar51._8_4_);
                  auVar117._12_4_ = -(uint)(iVar18 < auVar51._12_4_);
                  auVar61._4_4_ = iVar154;
                  auVar61._0_4_ = iVar154;
                  auVar61._8_4_ = iVar158;
                  auVar61._12_4_ = iVar158;
                  auVar97._4_4_ = -(uint)(auVar51._4_4_ == iVar14);
                  auVar97._12_4_ = -(uint)(auVar51._12_4_ == iVar18);
                  auVar97._0_4_ = auVar97._4_4_;
                  auVar97._8_4_ = auVar97._12_4_;
                  auVar117._0_4_ = auVar117._4_4_;
                  auVar117._8_4_ = auVar117._12_4_;
                  auVar51 = auVar97 & auVar61 | auVar117;
                  auVar51 = packssdw(auVar51,auVar51);
                  auVar51 = packssdw(auVar51 ^ auVar125,auVar51 ^ auVar125);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffe6) = cVar10;
                  }
                  auVar133 = pshufhw(auVar61,auVar61,0x84);
                  auVar71 = pshufhw(auVar97,auVar97,0x84);
                  auVar135 = pshufhw(auVar133,auVar117,0x84);
                  auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar125;
                  auVar133 = packssdw(auVar133,auVar133);
                  auVar133 = packsswb(auVar133,auVar133);
                  if ((auVar133._0_4_ >> 0x18 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffe8) = cVar10;
                  }
                  auVar133 = (auVar45 | auVar128) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar133._0_4_);
                  auVar63._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar133._8_4_);
                  auVar63._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                  auVar98._4_4_ = iVar154;
                  auVar98._0_4_ = iVar154;
                  auVar98._8_4_ = iVar158;
                  auVar98._12_4_ = iVar158;
                  auVar51 = pshuflw(auVar51,auVar98,0xe8);
                  auVar62._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                  auVar62._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                  auVar62._0_4_ = auVar62._4_4_;
                  auVar62._8_4_ = auVar62._12_4_;
                  auVar135 = pshuflw(auVar125,auVar62,0xe8);
                  auVar63._0_4_ = auVar63._4_4_;
                  auVar63._8_4_ = auVar63._12_4_;
                  auVar133 = pshuflw(auVar51,auVar63,0xe8);
                  auVar126._8_4_ = 0xffffffff;
                  auVar126._0_8_ = 0xffffffffffffffff;
                  auVar126._12_4_ = 0xffffffff;
                  auVar51 = (auVar133 | auVar135 & auVar51) ^ auVar126;
                  auVar51 = packssdw(auVar51,auVar51);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffea) = cVar10;
                  }
                  auVar63 = auVar62 & auVar98 | auVar63;
                  auVar51 = packssdw(auVar63,auVar63);
                  auVar51 = packssdw(auVar51 ^ auVar126,auVar51 ^ auVar126);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._4_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffec) = cVar10;
                  }
                  auVar51 = (auVar45 | auVar77) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar51._0_4_);
                  auVar118._4_4_ = -(uint)(iVar14 < auVar51._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar51._8_4_);
                  auVar118._12_4_ = -(uint)(iVar18 < auVar51._12_4_);
                  auVar64._4_4_ = iVar154;
                  auVar64._0_4_ = iVar154;
                  auVar64._8_4_ = iVar158;
                  auVar64._12_4_ = iVar158;
                  auVar99._4_4_ = -(uint)(auVar51._4_4_ == iVar14);
                  auVar99._12_4_ = -(uint)(auVar51._12_4_ == iVar18);
                  auVar99._0_4_ = auVar99._4_4_;
                  auVar99._8_4_ = auVar99._12_4_;
                  auVar118._0_4_ = auVar118._4_4_;
                  auVar118._8_4_ = auVar118._12_4_;
                  auVar51 = auVar99 & auVar64 | auVar118;
                  auVar51 = packssdw(auVar51,auVar51);
                  auVar51 = packssdw(auVar51 ^ auVar126,auVar51 ^ auVar126);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xffffffffffffffee) = cVar10;
                  }
                  auVar133 = pshufhw(auVar64,auVar64,0x84);
                  auVar71 = pshufhw(auVar99,auVar99,0x84);
                  auVar135 = pshufhw(auVar133,auVar118,0x84);
                  auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar126;
                  auVar133 = packssdw(auVar133,auVar133);
                  auVar133 = packsswb(auVar133,auVar133);
                  if ((auVar133._6_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffff0) = cVar10;
                  }
                  auVar133 = (auVar45 | auVar56) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar133._0_4_);
                  auVar66._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar133._8_4_);
                  auVar66._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                  auVar100._4_4_ = iVar154;
                  auVar100._0_4_ = iVar154;
                  auVar100._8_4_ = iVar158;
                  auVar100._12_4_ = iVar158;
                  auVar51 = pshuflw(auVar51,auVar100,0xe8);
                  auVar65._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                  auVar65._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                  auVar65._0_4_ = auVar65._4_4_;
                  auVar65._8_4_ = auVar65._12_4_;
                  auVar135 = pshuflw(auVar126,auVar65,0xe8);
                  auVar66._0_4_ = auVar66._4_4_;
                  auVar66._8_4_ = auVar66._12_4_;
                  auVar133 = pshuflw(auVar51,auVar66,0xe8);
                  auVar127._8_4_ = 0xffffffff;
                  auVar127._0_8_ = 0xffffffffffffffff;
                  auVar127._12_4_ = 0xffffffff;
                  auVar51 = (auVar133 | auVar135 & auVar51) ^ auVar127;
                  auVar51 = packssdw(auVar51,auVar51);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffff2) = cVar10;
                  }
                  auVar66 = auVar65 & auVar100 | auVar66;
                  auVar51 = packssdw(auVar66,auVar66);
                  auVar51 = packssdw(auVar51 ^ auVar127,auVar51 ^ auVar127);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._8_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffff4) = cVar10;
                  }
                  auVar51 = (auVar45 | auVar130) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar51._0_4_);
                  auVar119._4_4_ = -(uint)(iVar14 < auVar51._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar51._8_4_);
                  auVar119._12_4_ = -(uint)(iVar18 < auVar51._12_4_);
                  auVar67._4_4_ = iVar154;
                  auVar67._0_4_ = iVar154;
                  auVar67._8_4_ = iVar158;
                  auVar67._12_4_ = iVar158;
                  auVar101._4_4_ = -(uint)(auVar51._4_4_ == iVar14);
                  auVar101._12_4_ = -(uint)(auVar51._12_4_ == iVar18);
                  auVar101._0_4_ = auVar101._4_4_;
                  auVar101._8_4_ = auVar101._12_4_;
                  auVar119._0_4_ = auVar119._4_4_;
                  auVar119._8_4_ = auVar119._12_4_;
                  auVar51 = auVar101 & auVar67 | auVar119;
                  auVar51 = packssdw(auVar51,auVar51);
                  auVar51 = packssdw(auVar51 ^ auVar127,auVar51 ^ auVar127);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffff6) = cVar10;
                  }
                  auVar133 = pshufhw(auVar67,auVar67,0x84);
                  auVar71 = pshufhw(auVar101,auVar101,0x84);
                  auVar135 = pshufhw(auVar133,auVar119,0x84);
                  auVar133 = (auVar135 | auVar71 & auVar133) ^ auVar127;
                  auVar133 = packssdw(auVar133,auVar133);
                  auVar133 = packsswb(auVar133,auVar133);
                  if ((auVar133._10_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffff8) = cVar10;
                  }
                  auVar133 = (auVar45 | auVar47) ^ _DAT_001a4410;
                  iVar154 = -(uint)(iVar12 < auVar133._0_4_);
                  auVar69._4_4_ = -(uint)(iVar14 < auVar133._4_4_);
                  iVar158 = -(uint)(iVar38 < auVar133._8_4_);
                  auVar69._12_4_ = -(uint)(iVar18 < auVar133._12_4_);
                  auVar102._4_4_ = iVar154;
                  auVar102._0_4_ = iVar154;
                  auVar102._8_4_ = iVar158;
                  auVar102._12_4_ = iVar158;
                  auVar51 = pshuflw(auVar51,auVar102,0xe8);
                  auVar68._4_4_ = -(uint)(auVar133._4_4_ == iVar14);
                  auVar68._12_4_ = -(uint)(auVar133._12_4_ == iVar18);
                  auVar68._0_4_ = auVar68._4_4_;
                  auVar68._8_4_ = auVar68._12_4_;
                  auVar135 = pshuflw(auVar127,auVar68,0xe8);
                  auVar69._0_4_ = auVar69._4_4_;
                  auVar69._8_4_ = auVar69._12_4_;
                  auVar133 = pshuflw(auVar51,auVar69,0xe8);
                  in_XMM6._8_4_ = 0xffffffff;
                  in_XMM6._0_8_ = 0xffffffffffffffff;
                  in_XMM6._12_4_ = 0xffffffff;
                  auVar51 = (auVar133 | auVar135 & auVar51) ^ in_XMM6;
                  auVar51 = packssdw(auVar51,auVar51);
                  in_XMM5 = packsswb(auVar51,auVar51);
                  if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffffa) = cVar10;
                  }
                  auVar69 = auVar68 & auVar102 | auVar69;
                  auVar51 = packssdw(auVar69,auVar69);
                  auVar51 = packssdw(auVar51 ^ in_XMM6,auVar51 ^ in_XMM6);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._12_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffffc) = cVar10;
                  }
                  auVar51 = (auVar45 | auVar124) ^ _DAT_001a4410;
                  auVar103._0_4_ = -(uint)(iVar12 < auVar51._0_4_);
                  auVar103._4_4_ = -(uint)(iVar14 < auVar51._4_4_);
                  auVar103._8_4_ = -(uint)(iVar38 < auVar51._8_4_);
                  auVar103._12_4_ = -(uint)(iVar18 < auVar51._12_4_);
                  auVar70._4_4_ = auVar103._0_4_;
                  auVar70._0_4_ = auVar103._0_4_;
                  auVar70._8_4_ = auVar103._8_4_;
                  auVar70._12_4_ = auVar103._8_4_;
                  auVar46._4_4_ = -(uint)(auVar51._4_4_ == iVar14);
                  auVar46._12_4_ = -(uint)(auVar51._12_4_ == iVar18);
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar52._4_4_ = auVar103._4_4_;
                  auVar52._0_4_ = auVar103._4_4_;
                  auVar52._8_4_ = auVar103._12_4_;
                  auVar52._12_4_ = auVar103._12_4_;
                  auVar51 = packssdw(auVar103,auVar46 & auVar70 | auVar52);
                  auVar51 = packssdw(auVar51 ^ in_XMM6,auVar51 ^ in_XMM6);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    *(char *)(psVar43 + uVar40 * 2 + 0xfffffffffffffffe) = cVar10;
                  }
                  auVar135 = pshufhw(auVar70,auVar70,0x84);
                  auVar51 = pshufhw(auVar46,auVar46,0x84);
                  auVar133 = pshufhw(auVar52,auVar52,0x84);
                  auVar51 = packssdw(auVar51 & auVar135,(auVar133 | auVar51 & auVar135) ^ in_XMM6);
                  auVar51 = packsswb(auVar51,auVar51);
                  if ((auVar51._14_2_ >> 8 & 1) != 0) {
                    *(char *)(psVar43 + uVar40 * 2) = cVar10;
                  }
                  uVar40 = uVar40 + 0x10;
                } while (((ulong)((uVar17 + uVar29) * (uVar33 + uVar41)) + 0xf & 0xfffffffffffffff0)
                         != uVar40);
              }
              uVar42 = uVar42 + 1;
              psVar43 = (stbi__uint16 *)((long)psVar43 + 1);
            } while (uVar42 != 4);
          }
          if (3 < uVar13) {
            if (ri->bits_per_channel == 0x10) {
              if (0 < iVar35) {
                uVar42 = 0;
                do {
                  uVar3 = data_02[uVar42 * 4 + 3];
                  if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                    fVar116 = 1.0 / ((float)uVar3 / 65535.0);
                    fVar95 = (1.0 - fVar116) * 65535.0;
                    auVar124._0_4_ =
                         (int)(fVar95 + fVar116 * (float)(*(uint *)(data_02 + uVar42 * 4) & 0xffff))
                    ;
                    auVar124._4_4_ =
                         (int)(fVar95 + fVar116 * (float)(*(uint *)(data_02 + uVar42 * 4) >> 0x10));
                    auVar124._8_4_ = (int)(fVar95 + fVar116 * 0.0);
                    auVar124._12_4_ = (int)(fVar95 + fVar116 * 0.0);
                    auVar124 = pshuflw(auVar124,auVar124,0xe8);
                    *(int *)(data_02 + uVar42 * 4) = auVar124._0_4_;
                    data_02[uVar42 * 4 + 2] =
                         (stbi__uint16)(int)((float)data_02[uVar42 * 4 + 2] * fVar116 + fVar95);
                  }
                  uVar42 = uVar42 + 1;
                } while ((uVar17 + uVar29) * (uVar33 + uVar41) != uVar42);
              }
            }
            else if (0 < iVar35) {
              uVar42 = 0;
              do {
                bVar28 = *(byte *)((long)data_02 + uVar42 * 4 + 3);
                if ((bVar28 != 0) && (bVar28 != 0xff)) {
                  fVar116 = 1.0 / ((float)bVar28 / 255.0);
                  fVar95 = (1.0 - fVar116) * 255.0;
                  *(char *)(data_02 + uVar42 * 2) =
                       (char)(int)((float)(byte)data_02[uVar42 * 2] * fVar116 + fVar95);
                  *(char *)((long)data_02 + uVar42 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)data_02 + uVar42 * 4 + 1) * fVar116 +
                                  fVar95);
                  *(char *)(data_02 + uVar42 * 2 + 1) =
                       (char)(int)((float)(byte)data_02[uVar42 * 2 + 1] * fVar116 + fVar95);
                }
                uVar42 = uVar42 + 1;
              } while ((uVar17 + uVar29) * (uVar33 + uVar41) != uVar42);
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              data_02 = stbi__convert_format16(data_02,4,req_comp,uVar20,uVar19);
            }
            else {
              data_02 = (stbi__uint16 *)
                        stbi__convert_format((uchar *)data_02,4,req_comp,uVar20,uVar19);
            }
            if (data_02 == (stbi__uint16 *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = uVar19;
          *x = uVar20;
          return data_02;
        }
LAB_00163f2a:
        pcVar22 = "Out of memory";
        goto LAB_00162849;
      }
    }
  }
  pcVar22 = "Very large image (corrupt?)";
LAB_00162849:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar22;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}